

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O0

int sam_hdr_add_lines(SAM_hdr *sh,char *lines,int len)

{
  SAM_hdr_item_s *pSVar1;
  SAM_hdr_item_s *pSVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  SAM_hdr_type *h_type_00;
  SAM_hdr_tag *pSVar6;
  char *pcVar7;
  bool bVar8;
  int local_80;
  int local_7c;
  int j_2;
  int j_1;
  SAM_hdr_type *p;
  SAM_hdr_type *t;
  SAM_hdr_tag *pSStack_60;
  int j;
  SAM_hdr_tag *last;
  SAM_hdr_tag *h_tag;
  SAM_hdr_type *h_type;
  int new;
  int l_start;
  khint_t k;
  khint32_t type;
  char *hdr;
  int text_offset;
  int lno;
  int i;
  int len_local;
  char *lines_local;
  SAM_hdr *sh_local;
  
  hdr._4_4_ = 1;
  lno = len;
  _i = lines;
  lines_local = (char *)sh;
  if (len == 0) {
    sVar4 = strlen(lines);
    lno = (int)sVar4;
  }
  sVar5 = ks_len((kstring_t *)lines_local);
  hdr._0_4_ = (int)sVar5;
  iVar3 = kputsn(_i,lno,(kstring_t *)lines_local);
  if (iVar3 == -1) {
    sh_local._4_4_ = -1;
  }
  else {
    _k = ks_str((kstring_t *)lines_local);
    _k = _k + (int)hdr;
    for (text_offset = 0; text_offset < lno; text_offset = text_offset + 1) {
      h_type._4_4_ = text_offset;
      if (_k[text_offset] != '@') {
        t._4_4_ = text_offset;
        while( true ) {
          bVar8 = false;
          if (t._4_4_ < lno) {
            bVar8 = _k[t._4_4_] != '\n';
          }
          if (!bVar8) break;
          t._4_4_ = t._4_4_ + 1;
        }
        sam_hdr_error("Header line does not start with \'@\'",_k + text_offset,lno - text_offset,
                      hdr._4_4_);
        return -1;
      }
      l_start = (int)_k[text_offset + 1] << 8 | (int)_k[text_offset + 2];
      if ((((_k[text_offset + 1] < 'A') || ('z' < _k[text_offset + 1])) ||
          (_k[text_offset + 2] < 'A')) || ('z' < _k[text_offset + 2])) {
        sam_hdr_error("Header line does not have a two character key",_k + text_offset,
                      lno - text_offset,hdr._4_4_);
        return -1;
      }
      text_offset = text_offset + 3;
      if (_k[text_offset] != '\n') {
        h_type_00 = (SAM_hdr_type *)pool_alloc(*(pool_alloc_t **)(lines_local + 0x28));
        if (h_type_00 == (SAM_hdr_type *)0x0) {
          return -1;
        }
        new = kh_put_sam_hdr(*(kh_sam_hdr_t **)(lines_local + 0x18),l_start,(int *)&h_type);
        if (new == 0xffffffff) {
          return -1;
        }
        if ((int)h_type == 0) {
          pSVar1 = *(SAM_hdr_item_s **)
                    (*(long *)(*(long *)(lines_local + 0x18) + 0x20) + (ulong)(uint)new * 8);
          pSVar2 = pSVar1->prev;
          pSVar2->next = pSVar1;
          if (pSVar1 == (SAM_hdr_item_s *)0x0) {
            __assert_fail("p->next = t",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/sam_header.c"
                          ,0x144,"int sam_hdr_add_lines(SAM_hdr *, const char *, int)");
          }
          pSVar2->next = h_type_00;
          h_type_00->prev = pSVar2;
          pSVar1->prev = h_type_00;
          h_type_00->next = pSVar1;
          h_type_00->order = pSVar2->order + 1;
        }
        else {
          *(SAM_hdr_type **)(*(long *)(*(long *)(lines_local + 0x18) + 0x20) + (ulong)(uint)new * 8)
               = h_type_00;
          h_type_00->next = h_type_00;
          h_type_00->prev = h_type_00;
          h_type_00->order = 0;
        }
        pSStack_60 = (SAM_hdr_tag *)0x0;
        if (((uint)l_start >> 8 == 0x43) && ((l_start & 0xffU) == 0x4f)) {
          if (_k[text_offset] != '\t') {
            sam_hdr_error("Missing tab",_k + h_type._4_4_,lno - h_type._4_4_,hdr._4_4_);
            return -1;
          }
          text_offset = text_offset + 1;
          local_7c = text_offset;
          while( true ) {
            bVar8 = false;
            if (local_7c < lno) {
              bVar8 = _k[local_7c] != '\n';
            }
            if (!bVar8) break;
            local_7c = local_7c + 1;
          }
          pSVar6 = (SAM_hdr_tag *)pool_alloc(*(pool_alloc_t **)(lines_local + 0x30));
          h_type_00->tag = pSVar6;
          if (pSVar6 == (SAM_hdr_tag *)0x0) {
            return -1;
          }
          pcVar7 = string_ndup(*(string_alloc_t **)(lines_local + 0x20),_k + text_offset,
                               (long)(local_7c - text_offset));
          pSVar6->str = pcVar7;
          pSVar6->len = local_7c - text_offset;
          pSVar6->next = (SAM_hdr_tag_s *)0x0;
          if (pSVar6->str == (char *)0x0) {
            return -1;
          }
          text_offset = local_7c;
        }
        else {
          do {
            if (_k[text_offset] != '\t') {
              sam_hdr_error("Missing tab",_k + h_type._4_4_,lno - h_type._4_4_,hdr._4_4_);
              return -1;
            }
            text_offset = text_offset + 1;
            local_80 = text_offset;
            while( true ) {
              bVar8 = false;
              if ((local_80 < lno) && (bVar8 = false, _k[local_80] != '\n')) {
                bVar8 = _k[local_80] != '\t';
              }
              if (!bVar8) break;
              local_80 = local_80 + 1;
            }
            pSVar6 = (SAM_hdr_tag *)pool_alloc(*(pool_alloc_t **)(lines_local + 0x30));
            if (pSVar6 == (SAM_hdr_tag *)0x0) {
              return -1;
            }
            pcVar7 = string_ndup(*(string_alloc_t **)(lines_local + 0x20),_k + text_offset,
                                 (long)(local_80 - text_offset));
            pSVar6->str = pcVar7;
            pSVar6->len = local_80 - text_offset;
            pSVar6->next = (SAM_hdr_tag_s *)0x0;
            if (pSVar6->str == (char *)0x0) {
              return -1;
            }
            if ((pSVar6->len < 3) || (pSVar6->str[2] != ':')) {
              sam_hdr_error("Malformed key:value pair",_k + h_type._4_4_,lno - h_type._4_4_,
                            hdr._4_4_);
              return -1;
            }
            if (pSStack_60 == (SAM_hdr_tag *)0x0) {
              h_type_00->tag = pSVar6;
            }
            else {
              pSStack_60->next = pSVar6;
            }
            text_offset = local_80;
            bVar8 = false;
            if (local_80 < lno) {
              bVar8 = _k[local_80] != '\n';
            }
            pSStack_60 = pSVar6;
          } while (bVar8);
        }
        iVar3 = sam_hdr_update_hashes((SAM_hdr *)lines_local,l_start,h_type_00);
        if (iVar3 == -1) {
          return -1;
        }
      }
    }
    sh_local._4_4_ = 0;
  }
  return sh_local._4_4_;
}

Assistant:

int sam_hdr_add_lines(SAM_hdr *sh, const char *lines, int len) {
    int i, lno = 1, text_offset;
    char *hdr;

    if (!len)
	len = strlen(lines);

    text_offset = ks_len(&sh->text);
    if (EOF == kputsn(lines, len, &sh->text))
	return -1;
    hdr = ks_str(&sh->text) + text_offset;

    for (i = 0; i < len; i++) {
	khint32_t type;
	khint_t k;

	int l_start = i, new;
	SAM_hdr_type *h_type;
	SAM_hdr_tag *h_tag, *last;

	if (hdr[i] != '@') {
	    int j;
	    for (j = i; j < len && hdr[j] != '\n'; j++)
		;
	    sam_hdr_error("Header line does not start with '@'",
			  &hdr[l_start], len - l_start, lno);
	    return -1;
	}

	type = (hdr[i+1]<<8) | hdr[i+2];
	if (hdr[i+1] < 'A' || hdr[i+1] > 'z' ||
	    hdr[i+2] < 'A' || hdr[i+2] > 'z') {
	    sam_hdr_error("Header line does not have a two character key",
			  &hdr[l_start], len - l_start, lno);
	    return -1;
	}

	i += 3;
	if (hdr[i] == '\n')
	    continue;

	// Add the header line type
	if (!(h_type = pool_alloc(sh->type_pool)))
	    return -1;
	if (-1 == (k = kh_put(sam_hdr, sh->h, type, &new)))
	    return -1;

	// Form the ring, either with self or other lines of this type
	if (!new) {
	    SAM_hdr_type *t = kh_val(sh->h, k), *p;
	    p = t->prev;
	    
	    assert(p->next = t);
	    p->next = h_type;
	    h_type->prev = p;

	    t->prev = h_type;
	    h_type->next = t;
	    h_type->order = p->order+1;
	} else {
	    kh_val(sh->h, k) = h_type;
	    h_type->prev = h_type->next = h_type;
	    h_type->order = 0;
	}

	// Parse the tags on this line
	last = NULL;
	if ((type>>8) == 'C' && (type&0xff) == 'O') {
	    int j;
	    if (hdr[i] != '\t') {
		sam_hdr_error("Missing tab",
			      &hdr[l_start], len - l_start, lno);
		return -1;
	    }

	    for (j = ++i; j < len && hdr[j] != '\n'; j++)
		;

	    if (!(h_type->tag = h_tag = pool_alloc(sh->tag_pool)))
		return -1;
	    h_tag->str = string_ndup(sh->str_pool, &hdr[i], j-i);
	    h_tag->len = j-i;
	    h_tag->next = NULL;
	    if (!h_tag->str)
		return -1;

	    i = j;

	} else {
	    do {
		int j;
		if (hdr[i] != '\t') {
		    sam_hdr_error("Missing tab",
				  &hdr[l_start], len - l_start, lno);
		    return -1;
		}

		for (j = ++i; j < len && hdr[j] != '\n' && hdr[j] != '\t'; j++)
		    ;
	    
		if (!(h_tag = pool_alloc(sh->tag_pool)))
		    return -1;
		h_tag->str = string_ndup(sh->str_pool, &hdr[i], j-i);
		h_tag->len = j-i;
		h_tag->next = NULL;
		if (!h_tag->str)
		    return -1;

		if (h_tag->len < 3 || h_tag->str[2] != ':') {
		    sam_hdr_error("Malformed key:value pair",
				  &hdr[l_start], len - l_start, lno);
		    return -1;
		}
	    
		if (last)
		    last->next = h_tag;
		else
		    h_type->tag = h_tag;

		last = h_tag;
		i = j;
	    } while (i < len && hdr[i] != '\n');
	}

	/* Update RG/SQ hashes */
	if (-1 == sam_hdr_update_hashes(sh, type, h_type))
	    return -1;
    }

    return 0;
}